

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O3

SUNErrCode SUNMatCopy_Band(SUNMatrix A,SUNMatrix B)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  void *pvVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  void *pvVar12;
  long lVar13;
  
  pvVar6 = A->content;
  lVar9 = *(long *)((long)pvVar6 + 0x18);
  pvVar12 = B->content;
  lVar7 = *(long *)((long)pvVar12 + 0x18);
  if (lVar7 < lVar9) {
    lVar10 = *(long *)((long)pvVar12 + 0x20);
    lVar8 = *(long *)((long)pvVar6 + 0x20);
  }
  else {
    lVar8 = *(long *)((long)pvVar6 + 0x20);
    lVar10 = *(long *)((long)pvVar12 + 0x20);
    if (lVar8 <= lVar10) goto LAB_0012be32;
  }
  if (lVar8 < lVar10) {
    lVar8 = lVar10;
  }
  if (lVar9 < lVar7) {
    lVar9 = lVar7;
  }
  lVar7 = *(long *)((long)pvVar6 + 0x28);
  if (*(long *)((long)pvVar6 + 0x28) < *(long *)((long)pvVar12 + 0x28)) {
    lVar7 = *(long *)((long)pvVar12 + 0x28);
  }
  lVar10 = lVar8 + 1 + lVar7;
  *(long *)((long)pvVar12 + 0x18) = lVar9;
  *(long *)((long)pvVar12 + 0x20) = lVar8;
  *(long *)((long)pvVar12 + 0x28) = lVar7;
  *(long *)((long)pvVar12 + 0x10) = lVar10;
  lVar9 = *(long *)((long)pvVar12 + 8) * lVar10;
  *(long *)((long)pvVar12 + 0x38) = lVar9;
  pvVar6 = realloc(*(void **)((long)pvVar12 + 0x30),lVar9 * 8);
  pvVar12 = B->content;
  *(void **)((long)pvVar12 + 0x30) = pvVar6;
  if (0 < *(long *)((long)pvVar12 + 8)) {
    lVar9 = 0;
    lVar7 = 0;
    do {
      *(long *)(*(long *)((long)pvVar12 + 0x40) + lVar7 * 8) =
           *(long *)((long)pvVar12 + 0x30) + lVar9;
      lVar7 = lVar7 + 1;
      pvVar12 = B->content;
      lVar9 = lVar9 + lVar10 * 8;
    } while (lVar7 < *(long *)((long)pvVar12 + 8));
  }
LAB_0012be32:
  if (0 < *(long *)((long)pvVar12 + 0x38)) {
    memset(*(void **)((long)pvVar12 + 0x30),0,*(long *)((long)pvVar12 + 0x38) << 3);
  }
  lVar9 = *(long *)((long)pvVar12 + 8);
  if (0 < lVar9) {
    lVar7 = *(long *)((long)pvVar12 + 0x28);
    lVar10 = *(long *)((long)pvVar12 + 0x40);
    pvVar6 = A->content;
    lVar8 = *(long *)((long)pvVar6 + 0x40);
    lVar1 = *(long *)((long)pvVar6 + 0x20);
    lVar2 = *(long *)((long)pvVar6 + 0x28);
    lVar3 = *(long *)((long)pvVar6 + 0x18);
    lVar11 = 0;
    do {
      if (-lVar3 <= lVar1) {
        lVar4 = *(long *)(lVar10 + lVar11 * 8);
        lVar5 = *(long *)(lVar8 + lVar11 * 8);
        lVar13 = -lVar3;
        do {
          *(undefined8 *)(lVar4 + lVar7 * 8 + lVar13 * 8) =
               *(undefined8 *)(lVar5 + lVar2 * 8 + lVar13 * 8);
          lVar13 = lVar13 + 1;
        } while (lVar1 + 1 != lVar13);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != lVar9);
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatCopy_Band(SUNMatrix A, SUNMatrix B)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j, colSize, ml, mu, smu;
  sunrealtype *A_colj, *B_colj;

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_BAND, SUN_ERR_ARG_WRONGTYPE);
  SUNAssert(SUNMatGetID(B) == SUNMATRIX_BAND, SUN_ERR_ARG_WRONGTYPE);
  SUNCheck(compatibleMatrices(A, B), SUN_ERR_ARG_DIMSMISMATCH);

  /* Grow B if A's bandwidth is larger */
  if ((SM_UBAND_B(A) > SM_UBAND_B(B)) || (SM_LBAND_B(A) > SM_LBAND_B(B)))
  {
    ml                     = SUNMAX(SM_LBAND_B(B), SM_LBAND_B(A));
    mu                     = SUNMAX(SM_UBAND_B(B), SM_UBAND_B(A));
    smu                    = SUNMAX(SM_SUBAND_B(B), SM_SUBAND_B(A));
    colSize                = smu + ml + 1;
    SM_CONTENT_B(B)->mu    = mu;
    SM_CONTENT_B(B)->ml    = ml;
    SM_CONTENT_B(B)->s_mu  = smu;
    SM_CONTENT_B(B)->ldim  = colSize;
    SM_CONTENT_B(B)->ldata = SM_COLUMNS_B(B) * colSize;
    SM_CONTENT_B(B)->data =
      (sunrealtype*)realloc(SM_CONTENT_B(B)->data,
                            SM_COLUMNS_B(B) * colSize * sizeof(sunrealtype));
    for (j = 0; j < SM_COLUMNS_B(B); j++)
    {
      SM_CONTENT_B(B)->cols[j] = SM_CONTENT_B(B)->data + j * colSize;
    }
  }

  /* Perform operation */
  SUNCheckCall(SUNMatZero_Band(B));
  for (j = 0; j < SM_COLUMNS_B(B); j++)
  {
    B_colj = SM_COLUMN_B(B, j);
    A_colj = SM_COLUMN_B(A, j);
    for (i = -SM_UBAND_B(A); i <= SM_LBAND_B(A); i++) { B_colj[i] = A_colj[i]; }
  }
  return SUN_SUCCESS;
}